

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O0

void * env_tilde_new(t_floatarg fnpoints,t_floatarg fperiod)

{
  _binbuf *p_Var1;
  _clock *p_Var2;
  t_symbol *s;
  t_pd p_Var3;
  double dVar4;
  int local_34;
  int i;
  t_sample *buf;
  t_sigenv *x;
  int period;
  int npoints;
  t_floatarg fperiod_local;
  t_floatarg fnpoints_local;
  
  x._4_4_ = (int)fnpoints;
  x._0_4_ = (int)fperiod;
  if (x._4_4_ < 1) {
    x._4_4_ = 0x400;
  }
  if ((int)x < 1) {
    x._0_4_ = x._4_4_ / 2;
  }
  if ((int)x < x._4_4_ / 0x20 + 1) {
    x._0_4_ = x._4_4_ / 0x20 + 1;
  }
  p_Var1 = (_binbuf *)getbytes((long)(x._4_4_ + 0x40) << 2);
  if (p_Var1 == (_binbuf *)0x0) {
    pd_error((void *)0x0,"env: couldn\'t allocate buffer");
    _fperiod_local = (t_object *)0x0;
  }
  else {
    _fperiod_local = (t_object *)pd_new(env_tilde_class);
    _fperiod_local[1].te_binbuf = p_Var1;
    *(int *)((long)&_fperiod_local[1].te_inlet + 4) = x._4_4_;
    *(undefined4 *)&_fperiod_local[1].te_outlet = 0;
    *(int *)((long)&_fperiod_local[1].te_outlet + 4) = (int)x;
    for (local_34 = 0; local_34 < 0x20; local_34 = local_34 + 1) {
      *(undefined4 *)(&_fperiod_local[1].te_width + (long)local_34 * 2) = 0;
    }
    for (local_34 = 0; local_34 < x._4_4_; local_34 = local_34 + 1) {
      dVar4 = cos(((double)local_34 * 6.28318) / (double)x._4_4_);
      (&p_Var1->b_n)[local_34] = (int)(float)((1.0 - dVar4) / (double)x._4_4_);
    }
    for (; local_34 < x._4_4_ + 0x40; local_34 = local_34 + 1) {
      (&p_Var1->b_n)[local_34] = 0;
    }
    p_Var2 = clock_new(_fperiod_local,env_tilde_tick);
    _fperiod_local[1].te_g.g_next = (_gobj *)p_Var2;
    s = gensym("float");
    p_Var3 = (t_pd)outlet_new(_fperiod_local,s);
    _fperiod_local[1].te_g.g_pd = p_Var3;
    *(undefined4 *)((long)&_fperiod_local[4].te_outlet + 4) = 0;
    *(undefined4 *)&_fperiod_local[4].te_inlet = 0x40;
  }
  return _fperiod_local;
}

Assistant:

static void *env_tilde_new(t_floatarg fnpoints, t_floatarg fperiod)
{
    int npoints = fnpoints;
    int period = fperiod;
    t_sigenv *x;
    t_sample *buf;
    int i;

    if (npoints < 1) npoints = 1024;
    if (period < 1) period = npoints/2;
    if (period < npoints / MAXOVERLAP + 1)
        period = npoints / MAXOVERLAP + 1;
    if (!(buf = getbytes(sizeof(t_sample) * (npoints + INITVSTAKEN))))
    {
        pd_error(0, "env: couldn't allocate buffer");
        return (0);
    }
    x = (t_sigenv *)pd_new(env_tilde_class);
    x->x_buf = buf;
    x->x_npoints = npoints;
    x->x_phase = 0;
    x->x_period = period;
    for (i = 0; i < MAXOVERLAP; i++) x->x_sumbuf[i] = 0;
    for (i = 0; i < npoints; i++)
        buf[i] = (1. - cos((2 * 3.14159 * i) / npoints))/npoints;
    for (; i < npoints+INITVSTAKEN; i++) buf[i] = 0;
    x->x_clock = clock_new(x, (t_method)env_tilde_tick);
    x->x_outlet = outlet_new(&x->x_obj, gensym("float"));
    x->x_f = 0;
    x->x_allocforvs = INITVSTAKEN;
    return (x);
}